

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *s;
  Ch *pCVar1;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_38;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *local_20;
  
  local_38.src_ = is->src_;
  local_38.dst_ = is->dst_;
  local_38.head_ = is->head_;
  local_20 = is;
  if (*local_38.src_ != '\"') {
    __assert_fail("s.Peek() == \'\\\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x3c2,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  s = local_38.src_ + 1;
  local_38.src_ = s;
  local_38.dst_ = s;
  ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            (this,&local_38,&local_38);
  if (*(int *)(this + 0x30) == 0) {
    pCVar1 = local_38.dst_ + ~(ulong)s;
    if ((ulong)pCVar1 >> 0x20 != 0) {
      __assert_fail("length <= 0xFFFFFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x3cb,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    this_00 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this_00,s,(SizeType)pCVar1);
  }
  local_20->head_ = local_38.head_;
  local_20->src_ = local_38.src_;
  local_20->dst_ = local_38.dst_;
  return;
}

Assistant:

~StreamLocalCopy() { original_ = s; }